

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramUniformTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::UniformCollection::addStructType
          (UniformCollection *this,StructType *type)

{
  StructType *local_18;
  StructType *type_local;
  UniformCollection *this_local;
  
  local_18 = type;
  type_local = (StructType *)this;
  std::vector<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>::push_back
            (&this->m_structTypes,&local_18);
  return;
}

Assistant:

void				addStructType		(const StructType* const type)	{ m_structTypes.push_back(type);	}